

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sutil.c
# Opt level: O2

void sCopy_CompCol_Matrix(SuperMatrix *A,SuperMatrix *B)

{
  int iVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  Dtype_t DVar5;
  Mtype_t MVar6;
  int_t iVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  
  DVar5 = A->Dtype;
  MVar6 = A->Mtype;
  iVar7 = A->nrow;
  B->Stype = A->Stype;
  B->Dtype = DVar5;
  B->Mtype = MVar6;
  B->nrow = iVar7;
  iVar1 = A->ncol;
  B->ncol = iVar1;
  puVar3 = (uint *)A->Store;
  puVar4 = (uint *)B->Store;
  uVar2 = *puVar3;
  *puVar4 = uVar2;
  uVar10 = 0;
  uVar8 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar8 = uVar10;
  }
  for (; uVar8 != uVar10; uVar10 = uVar10 + 1) {
    *(undefined4 *)(*(long *)(puVar4 + 2) + uVar10 * 4) =
         *(undefined4 *)(*(long *)(puVar3 + 2) + uVar10 * 4);
  }
  for (uVar10 = 0; uVar8 != uVar10; uVar10 = uVar10 + 1) {
    *(undefined4 *)(*(long *)(puVar4 + 4) + uVar10 * 4) =
         *(undefined4 *)(*(long *)(puVar3 + 4) + uVar10 * 4);
  }
  for (lVar9 = 0; lVar9 <= iVar1; lVar9 = lVar9 + 1) {
    *(undefined4 *)(*(long *)(puVar4 + 6) + lVar9 * 4) =
         *(undefined4 *)(*(long *)(puVar3 + 6) + lVar9 * 4);
  }
  return;
}

Assistant:

void
sCopy_CompCol_Matrix(SuperMatrix *A, SuperMatrix *B)
{
    NCformat *Astore, *Bstore;
    int      ncol, nnz, i;

    B->Stype = A->Stype;
    B->Dtype = A->Dtype;
    B->Mtype = A->Mtype;
    B->nrow  = A->nrow;;
    B->ncol  = ncol = A->ncol;
    Astore   = (NCformat *) A->Store;
    Bstore   = (NCformat *) B->Store;
    Bstore->nnz = nnz = Astore->nnz;
    for (i = 0; i < nnz; ++i)
	((float *)Bstore->nzval)[i] = ((float *)Astore->nzval)[i];
    for (i = 0; i < nnz; ++i) Bstore->rowind[i] = Astore->rowind[i];
    for (i = 0; i <= ncol; ++i) Bstore->colptr[i] = Astore->colptr[i];
}